

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

void __thiscall MIDI::Track::Track(Track *this,byte *data,dword size)

{
  byte *pbVar1;
  Track *pTVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int dataLength;
  ulong uVar6;
  dword dVar7;
  byte bVar8;
  MetaTextEvent *pMVar9;
  ChannelControllerEvent *pCVar10;
  byte *pbVar11;
  long lVar12;
  ChannelControllerEvent **ppCVar13;
  vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_> *pvVar14;
  ChannelControllerEvent *local_128;
  ChannelControllerEvent *local_120;
  byte local_114;
  byte local_113;
  byte local_112;
  byte local_111;
  long local_110;
  dword local_108;
  MetaTextEvent *local_100;
  MetaTextEvent *local_f8;
  MetaTextEvent *local_f0;
  uint local_e8;
  byte local_e1;
  byte *local_e0;
  dword local_d8;
  byte local_c9;
  uint local_c8;
  byte local_c1;
  dword local_c0;
  Track *local_b8;
  vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_> *local_b0;
  ChannelControllerEvent *local_a8;
  ChannelControllerEvent *local_a0;
  ChannelEvent *event_1;
  byte param2;
  byte param1;
  int channel;
  byte command;
  dword dStack_88;
  int i_1;
  unsigned_long __vla_expr1;
  ulong local_78;
  dword length_1;
  MetaTextEvent *local_68;
  MetaEvent *event;
  dword dStack_58;
  int i;
  unsigned_long __vla_expr0;
  ulong local_48;
  dword length;
  byte type;
  byte eventType;
  dword local_30;
  dword deltaTime;
  int lastChannel;
  byte lastMIDICommand;
  dword size_local;
  byte *data_local;
  Track *this_local;
  
  local_b8 = this;
  _lastChannel = size;
  size_local = (dword)data;
  data_local = (byte *)this;
  Chunk::Chunk(&this->super_Chunk);
  (local_b8->super_Chunk)._vptr_Chunk = (_func_int **)&PTR_data_00111b90;
  local_b8->_data = (byte *)size_local;
  local_b8->_size = _lastChannel;
  local_b8->_pos = 0;
  local_b0 = &local_b8->_events;
  std::vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>::vector(local_b0);
  ppCVar13 = &local_128;
  while (pTVar2 = local_b8, local_b8->_pos < local_b8->_size) {
    *(undefined8 *)((long)ppCVar13 + -8) = 0x10a905;
    local_c0 = readNextVariableLength(pTVar2);
    pTVar2 = local_b8;
    local_30 = local_c0;
    *(undefined8 *)((long)ppCVar13 + -8) = 0x10a925;
    local_c1 = readNextByte(pTVar2);
    pTVar2 = local_b8;
    local_c8 = (uint)local_c1;
    length._3_1_ = local_c1;
    if ((local_c8 == 0xf0) || (local_c8 == 0xf7)) {
      *(undefined8 *)((long)ppCVar13 + -8) = 0x10abb1;
      local_108 = readNextVariableLength(pTVar2);
      lVar12 = (long)ppCVar13 - (local_108 + 0xf & 0xfffffffffffffff0);
      local_110 = lVar12;
      dStack_88 = local_108;
      __vla_expr1 = (unsigned_long)ppCVar13;
      local_78 = local_108;
      for (channel = 0; pTVar2 = local_b8, ppCVar13 = (ChannelControllerEvent **)__vla_expr1,
          (ulong)(long)channel < local_78; channel = channel + 1) {
        *(undefined8 *)(lVar12 + -8) = 0x10ac12;
        bVar8 = readNextByte(pTVar2);
        *(byte *)(local_110 + channel) = bVar8;
        local_111 = bVar8;
      }
    }
    else if (local_c8 == 0xff) {
      *(undefined8 *)((long)ppCVar13 + -8) = 0x10a98f;
      local_c9 = readNextByte(pTVar2);
      pTVar2 = local_b8;
      length._2_1_ = local_c9;
      *(undefined8 *)((long)ppCVar13 + -8) = 0x10a9ac;
      local_d8 = readNextVariableLength(pTVar2);
      lVar12 = -(local_d8 + 0xf & 0xfffffffffffffff0);
      pbVar11 = (byte *)((long)ppCVar13 + lVar12);
      local_e0 = pbVar11;
      dStack_58 = local_d8;
      __vla_expr0 = (unsigned_long)ppCVar13;
      local_48 = local_d8;
      for (event._4_4_ = 0; pTVar2 = local_b8, (ulong)(long)event._4_4_ < local_48;
          event._4_4_ = event._4_4_ + 1) {
        pbVar11[-8] = '\a';
        pbVar11[-7] = 0xaa;
        pbVar11[-6] = '\x10';
        pbVar11[-5] = '\0';
        pbVar11[-4] = '\0';
        pbVar11[-3] = '\0';
        pbVar11[-2] = '\0';
        pbVar11[-1] = '\0';
        bVar8 = readNextByte(pTVar2);
        local_e0[event._4_4_] = bVar8;
        local_e1 = bVar8;
      }
      local_e8 = (uint)length._2_1_;
      if ((local_e8 - 1 < 3) || (local_e8 == 6)) {
        pbVar11[-8] = 'h';
        pbVar11[-7] = 0xaa;
        pbVar11[-6] = '\x10';
        pbVar11[-5] = '\0';
        pbVar11[-4] = '\0';
        pbVar11[-3] = '\0';
        pbVar11[-2] = '\0';
        pbVar11[-1] = '\0';
        pMVar9 = (MetaTextEvent *)operator_new(0x38);
        dVar7 = local_30;
        bVar3 = length._2_1_;
        uVar6 = local_48;
        pbVar1 = local_e0;
        local_f0 = pMVar9;
        pbVar11[-8] = 0x90;
        pbVar11[-7] = 0xaa;
        pbVar11[-6] = '\x10';
        pbVar11[-5] = '\0';
        pbVar11[-4] = '\0';
        pbVar11[-3] = '\0';
        pbVar11[-2] = '\0';
        pbVar11[-1] = '\0';
        MetaTextEvent::MetaTextEvent(pMVar9,dVar7,bVar3,pbVar1,uVar6);
        local_68 = local_f0;
      }
      else if (local_e8 == 0x51) {
        builtin_memcpy((byte *)((long)ppCVar13 + lVar12 + -8),"ɪ\x10",4);
        pbVar11[-4] = '\0';
        pbVar11[-3] = '\0';
        pbVar11[-2] = '\0';
        pbVar11[-1] = '\0';
        pMVar9 = (MetaTextEvent *)operator_new(0x20);
        dVar7 = local_30;
        bVar3 = length._2_1_;
        uVar6 = local_48;
        pbVar1 = local_e0;
        local_f8 = pMVar9;
        pbVar11[-8] = 0xf1;
        pbVar11[-7] = 0xaa;
        pbVar11[-6] = '\x10';
        pbVar11[-5] = '\0';
        pbVar11[-4] = '\0';
        pbVar11[-3] = '\0';
        pbVar11[-2] = '\0';
        pbVar11[-1] = '\0';
        MetaNumberEvent::MetaNumberEvent((MetaNumberEvent *)pMVar9,dVar7,bVar3,pbVar1,uVar6);
        local_68 = local_f8;
      }
      else {
        pbVar11[-8] = '\'';
        pbVar11[-7] = 0xab;
        pbVar11[-6] = '\x10';
        pbVar11[-5] = '\0';
        pbVar11[-4] = '\0';
        pbVar11[-3] = '\0';
        pbVar11[-2] = '\0';
        pbVar11[-1] = '\0';
        pMVar9 = (MetaTextEvent *)operator_new(0x28);
        dVar7 = local_30;
        bVar3 = length._2_1_;
        pbVar1 = local_e0;
        dataLength = (int)local_48;
        local_100 = pMVar9;
        pbVar11[-8] = 'O';
        pbVar11[-7] = 0xab;
        pbVar11[-6] = '\x10';
        pbVar11[-5] = '\0';
        pbVar11[-4] = '\0';
        pbVar11[-3] = '\0';
        pbVar11[-2] = '\0';
        pbVar11[-1] = '\0';
        MetaGenericEvent::MetaGenericEvent((MetaGenericEvent *)pMVar9,dVar7,bVar3,pbVar1,dataLength)
        ;
        local_68 = local_100;
      }
      pvVar14 = &local_b8->_events;
      length_1 = (dword)local_68;
      pbVar11[-8] = 0x97;
      pbVar11[-7] = 0xab;
      pbVar11[-6] = '\x10';
      pbVar11[-5] = '\0';
      pbVar11[-4] = '\0';
      pbVar11[-3] = '\0';
      pbVar11[-2] = '\0';
      pbVar11[-1] = '\0';
      std::vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>::push_back
                (pvVar14,(value_type *)&length_1);
      ppCVar13 = (ChannelControllerEvent **)__vla_expr0;
    }
    else {
      if ((int)(uint)local_c1 >> 7 == 1) {
        param1 = local_c1 >> 4;
        event_1._4_4_ = local_c1 & 0xf;
        *(undefined8 *)((long)ppCVar13 + -8) = 0x10ac80;
        local_112 = readNextByte(pTVar2);
        pTVar2 = local_b8;
        event_1._3_1_ = local_112;
        *(undefined8 *)((long)ppCVar13 + -8) = 0x10aca0;
        local_113 = readNextByte(pTVar2);
        event_1._2_1_ = local_113;
      }
      else {
        param1 = deltaTime._7_1_;
        event_1._4_4_ = (uint)deltaTime;
        event_1._3_1_ = local_c1;
        *(undefined8 *)((long)ppCVar13 + -8) = 0x10acdd;
        local_114 = readNextByte(pTVar2);
        event_1._2_1_ = local_114;
      }
      local_a0 = (ChannelControllerEvent *)0x0;
      if (param1 == '\v') {
        *(undefined8 *)((long)ppCVar13 + -8) = 0x10ad12;
        pCVar10 = (ChannelControllerEvent *)operator_new(0x28);
        dVar7 = local_30;
        uVar5 = event_1._4_4_;
        bVar4 = event_1._3_1_;
        bVar3 = event_1._2_1_;
        local_120 = pCVar10;
        *(undefined8 *)((long)ppCVar13 + -8) = 0x10ad40;
        ChannelControllerEvent::ChannelControllerEvent(pCVar10,dVar7,uVar5,(uint)bVar4,(uint)bVar3);
        local_a0 = local_120;
      }
      else {
        *(undefined8 *)((long)ppCVar13 + -8) = 0x10ad7c;
        pCVar10 = (ChannelControllerEvent *)operator_new(0x20);
        dVar7 = local_30;
        bVar8 = param1;
        uVar5 = event_1._4_4_;
        bVar4 = event_1._3_1_;
        bVar3 = event_1._2_1_;
        local_128 = pCVar10;
        *(undefined8 *)((long)ppCVar13 + -8) = 0x10adb2;
        ChannelEvent::ChannelEvent
                  ((ChannelEvent *)pCVar10,dVar7,bVar8,uVar5,(uint)bVar4,(uint)bVar3);
        local_a0 = local_128;
      }
      pvVar14 = &local_b8->_events;
      local_a8 = local_a0;
      *(undefined8 *)((long)ppCVar13 + -8) = 0x10ae03;
      std::vector<MIDI::Event_*,_std::allocator<MIDI::Event_*>_>::push_back
                (pvVar14,(value_type *)&local_a8);
      deltaTime._7_1_ = param1;
      deltaTime._0_4_ = event_1._4_4_;
    }
  }
  return;
}

Assistant:

Track::Track(byte* data,dword size)
    : _data(data),_size(size),_pos(0)
  {
    byte lastMIDICommand;
    int lastChannel;
    
    while(_pos<_size)
      {
	dword deltaTime=readNextVariableLength();
	byte eventType=readNextByte();
	
	switch(eventType)
	  {
	  case 0xFF: //Meta event
	    {
	      byte type=readNextByte();
	      dword length=readNextVariableLength();
	      byte metaData[length];
	      for(int i=0;i<length;i++)
		{
		  metaData[i]=readNextByte();
		}
	      
	      MetaEvent *event;
	      switch(type)
		{
		case MIDI_METAEVENT_TEXT:
		case MIDI_METAEVENT_COPYRIGHT:
		case MIDI_METAEVENT_TRACKNAME:
		case MIDI_METAEVENT_MAKER:
		  event=new MetaTextEvent(deltaTime,type,metaData,length);
		  break;
		case MIDI_METAEVENT_SETTEMPO:
		  event=new MetaNumberEvent(deltaTime,type,metaData,length);
		  break;
		default:
		  event=new MetaGenericEvent(deltaTime,type,metaData,length);
		  break;
		}
	      _events.push_back(event);
	    }
	    break;
	  case 0xF0: // System Exclusive Events
	  case 0xF7:
	    {
	      dword length=readNextVariableLength();
	      byte sysData[length];
	      for(int i=0;i<length;i++)
		{
		  sysData[i]=readNextByte();
		}
#warning "System Exclusive events are unimplemented"
	      // IGNORE
	    }
	    break;
	  default:
	    { // Everything else is a channel event
	      byte command;
	      int channel;
	      byte param1;
	      byte param2;
	      
	      if((eventType>>7)==1) // MSB of 1 indicates that the first 4 bits are the channel event type
		{
		  /*
		   * 4 bits:event type
		   * 4 bits:channel
		   * 1 byte:param1
		   * 1 byte:param2
		   */
		  command=(0xF0&eventType)>>4;
		  channel=(int)(0x0F & eventType);
		  param1=readNextByte();
		  param2=readNextByte();
		}
	      else // This is a running status, since MSB==0
		{
		  /*
		   * Event type/channel are from previous event
		   * 1 byte:param1
		   * 1 byte:param2
		   */
		  command=lastMIDICommand;
		  channel=lastChannel;
		  param1=eventType;
		  param2=readNextByte();
		}
	      
	      // Store the event
	      ChannelEvent *event=0;
	      if(command==MIDI_CHEVENT_CONTROLLER)
		event=new ChannelControllerEvent(deltaTime,channel,param1,param2);
	      else
		event=new ChannelEvent(deltaTime,command,channel,param1,param2);
	      
	      _events.push_back(event);
	      
	      lastMIDICommand=command;
	      lastChannel=channel;
	    }
	    break;
	  }
      }
  }